

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t zeGetKernelProcAddrTable(ze_api_version_t version,ze_kernel_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_kernel_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= driver::context) {
      pDdiTable->pfnCreate = driver::zeKernelCreate;
      pDdiTable->pfnDestroy = driver::zeKernelDestroy;
      pDdiTable->pfnSetCacheConfig = driver::zeKernelSetCacheConfig;
      pDdiTable->pfnSetGroupSize = driver::zeKernelSetGroupSize;
      pDdiTable->pfnSuggestGroupSize = driver::zeKernelSuggestGroupSize;
      pDdiTable->pfnSuggestMaxCooperativeGroupCount =
           driver::zeKernelSuggestMaxCooperativeGroupCount;
      pDdiTable->pfnSetArgumentValue = driver::zeKernelSetArgumentValue;
      pDdiTable->pfnSetIndirectAccess = driver::zeKernelSetIndirectAccess;
      pDdiTable->pfnGetIndirectAccess = driver::zeKernelGetIndirectAccess;
      pDdiTable->pfnGetSourceAttributes = driver::zeKernelGetSourceAttributes;
      pDdiTable->pfnGetProperties = driver::zeKernelGetProperties;
      pDdiTable->pfnGetName = driver::zeKernelGetName;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetKernelProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_kernel_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnCreate                                 = driver::zeKernelCreate;

    pDdiTable->pfnDestroy                                = driver::zeKernelDestroy;

    pDdiTable->pfnSetCacheConfig                         = driver::zeKernelSetCacheConfig;

    pDdiTable->pfnSetGroupSize                           = driver::zeKernelSetGroupSize;

    pDdiTable->pfnSuggestGroupSize                       = driver::zeKernelSuggestGroupSize;

    pDdiTable->pfnSuggestMaxCooperativeGroupCount        = driver::zeKernelSuggestMaxCooperativeGroupCount;

    pDdiTable->pfnSetArgumentValue                       = driver::zeKernelSetArgumentValue;

    pDdiTable->pfnSetIndirectAccess                      = driver::zeKernelSetIndirectAccess;

    pDdiTable->pfnGetIndirectAccess                      = driver::zeKernelGetIndirectAccess;

    pDdiTable->pfnGetSourceAttributes                    = driver::zeKernelGetSourceAttributes;

    pDdiTable->pfnGetProperties                          = driver::zeKernelGetProperties;

    pDdiTable->pfnGetName                                = driver::zeKernelGetName;

    return result;
}